

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::DataDeclarationSyntax::DataDeclarationSyntax
          (DataDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,TokenList *modifiers,
          DataTypeSyntax *type,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,
          Token semi)

{
  size_t sVar1;
  pointer ppAVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  long lVar6;
  ulong uVar7;
  
  (this->super_MemberSyntax).super_SyntaxNode.kind = DataDeclaration;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c7548;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c7a10;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar6 = 0;
    do {
      *(DataDeclarationSyntax **)(*(long *)((long)ppAVar2 + lVar6) + 8) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  (this->modifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (modifiers->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(modifiers->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (modifiers->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->modifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (modifiers->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->modifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->modifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->modifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c7548;
  (this->modifiers).super_SyntaxListBase.childCount = (modifiers->super_SyntaxListBase).childCount;
  sVar1 = (modifiers->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (modifiers->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  (this->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->modifiers).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005c7488
  ;
  (this->type).ptr = type;
  uVar4 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (declarators->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005cadb0;
  sVar1 = (declarators->elements)._M_extent._M_extent_value;
  (this->declarators).elements._M_ptr = (declarators->elements)._M_ptr;
  (this->declarators).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->modifiers).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  (type->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->declarators).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar6 = 0;
    do {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->declarators).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar6));
      (*ppSVar5)->parent = (SyntaxNode *)this;
      lVar6 = lVar6 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

DataDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, const TokenList& modifiers, DataTypeSyntax& type, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::DataDeclaration, attributes), modifiers(modifiers), type(&type), declarators(declarators), semi(semi) {
        this->modifiers.parent = this;
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }